

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O0

void __thiscall
TEST_TestMemoryAccountant_reportAllocations_TestShell::
~TEST_TestMemoryAccountant_reportAllocations_TestShell
          (TEST_TestMemoryAccountant_reportAllocations_TestShell *this)

{
  TEST_TestMemoryAccountant_reportAllocations_TestShell *this_local;
  
  ~TEST_TestMemoryAccountant_reportAllocations_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(TestMemoryAccountant, reportAllocations)
{
    accountant.dealloc(8);
    accountant.dealloc(8);
    accountant.dealloc(8);

    accountant.alloc(4);
    accountant.dealloc(4);
    accountant.alloc(4);
    STRCMP_EQUAL("CppUTest Memory Accountant report:\n"
                 "Allocation size     # allocations    # deallocations   max # allocations at one time\n"
                 "    4                   2                1                 1\n"
                 "    8                   0                3                 0\n"
                 "   Thank you for your business\n"
                 , accountant.report().asCharString());
}